

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

CompositeISE *
Saturation::SaturationAlgorithm::createISE
          (Problem *prb,Options *opt,Ordering *ordering,bool alascaTakesOver)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Condensation CVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  CompositeISE *this;
  ImmediateSimplificationEngine *pIVar7;
  SimplifyingGeneratingInference1 *pSVar8;
  InterpretedEvaluation *this_00;
  ulong uVar9;
  PolynomialEvaluationRule *this_01;
  UndesiredAnswerLiteralRemoval *this_02;
  char cVar10;
  undefined8 *puVar11;
  undefined *puVar12;
  string local_50;
  
  this = (CompositeISE *)::operator_new(0x20);
  (this->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
       (SaturationAlgorithm *)0x0;
  (this->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
       (_func_int **)&PTR__CompositeISE_00b657f8;
  this->_inners = (ISList *)0x0;
  this->_innersMany = (ISList *)0x0;
  bVar5 = Kernel::Problem::hasEquality(prb);
  cVar10 = '\x01';
  if (!bVar5) {
    bVar5 = Kernel::Problem::hasFOOL(prb);
    if (bVar5) {
      cVar10 = (opt->_FOOLParamodulation).super_OptionValue<bool>.super_AbstractOptionValue.
               field_0x92;
    }
    else {
      cVar10 = '\0';
    }
  }
  if ((cVar10 != '\0') &&
     ((opt->_equationalTautologyRemoval).super_OptionValue<bool>.super_AbstractOptionValue.
      field_0x92 == '\x01')) {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(400);
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__EquationalTautologyRemoval_00b641a0;
    DP::SimpleCongruenceClosure::SimpleCongruenceClosure
              ((SimpleCongruenceClosure *)(pIVar7 + 1),(Ordering *)0x0);
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  CVar2 = (opt->_condensation).super_OptionValue<Shell::Options::Condensation>.actualValue;
  if (CVar2 == ON) {
    puVar12 = &Inferences::Condensation::vtable;
LAB_00690f59:
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)(puVar12 + 0x10);
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  else if (CVar2 == FAST) {
    puVar12 = &Inferences::FastCondensation::vtable;
    goto LAB_00690f59;
  }
  if (*(char *)(::Lib::env + 0xee42) == '\x01') {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b63ca8;
    Inferences::CompositeISE::addFront(this,pIVar7);
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b63d60;
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  if (*(char *)(::Lib::env + 0xf1a2) == '\x01') {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b659f8;
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  bVar5 = Kernel::Problem::hasLogicalProxy(prb);
  if (bVar5) {
LAB_00691055:
    bVar5 = Kernel::Problem::isHigherOrder(prb);
    if ((bVar5) && (*(char *)(::Lib::env + 0xed6a) == '\0')) {
      iVar6 = *(int *)(::Lib::env + 0xf538);
      pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b65968;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      if (iVar6 == 0) {
        (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
             (_func_int **)&PTR__InferenceEngine_00b63558;
        Inferences::CompositeISE::addFrontMany(this,pIVar7);
      }
      else {
        (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
             (_func_int **)&PTR__InferenceEngine_00b634f8;
        Inferences::CompositeISE::addFront(this,pIVar7);
      }
      pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b633e0;
      Inferences::CompositeISE::addFront(this,pIVar7);
    }
  }
  else {
    bVar5 = Kernel::Problem::hasBoolVar(prb);
    if (bVar5) goto LAB_00691055;
    bVar5 = Kernel::Problem::hasFOOL(prb);
    if (bVar5) goto LAB_00691055;
  }
  bVar5 = Kernel::Problem::hasFOOL(prb);
  if (((bVar5) &&
      ((opt->_casesSimp).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\x01')) &&
     ((opt->_cases).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92 == '\0')) {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b63898;
    Inferences::CompositeISE::addFrontMany(this,pIVar7);
  }
  if (cVar10 != '\0') {
    if (*(char *)(DAT_00b7e1b0 + 0x1c8) == '\x01') {
      pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b63e20;
      Inferences::CompositeISE::addFront(this,pIVar7);
    }
    if (((cVar10 != '\0') && (*(int *)(DAT_00b7e1b0 + 0x26c) != 0)) &&
       ((opt->_termAlgebraInferences).super_OptionValue<bool>.super_AbstractOptionValue.field_0x92
        == '\x01')) {
      pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b668e8;
      Inferences::CompositeISE::addFront(this,pIVar7);
      pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b669a8;
      Inferences::CompositeISE::addFront(this,pIVar7);
      pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
      (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
           (_func_int **)&PTR__InferenceEngine_00b66a08;
      Inferences::CompositeISE::addFront(this,pIVar7);
    }
  }
  bVar5 = Kernel::Problem::hasInterpretedOperations(prb);
  if (!bVar5) {
    bVar5 = Kernel::Problem::hasNumerals(prb);
    if (!bVar5) goto LAB_0069147b;
  }
  if (*(int *)(::Lib::env + 0xeb98) == 0) {
    Inferences::allArithmeticSubtermGeneralizations();
    uVar4 = local_50.field_2._M_allocated_capacity;
    for (puVar11 = (undefined8 *)local_50._M_string_length; puVar11 != (undefined8 *)uVar4;
        puVar11 = puVar11 + 1) {
      pIVar7 = Inferences::SimplifyingGeneratingInference1::asISE
                         ((SimplifyingGeneratingInference1 *)*puVar11);
      Inferences::CompositeISE::addFront(this,pIVar7);
    }
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      uVar9 = (long)local_50._M_dataplus._M_p * 8 + 0xfU & 0xfffffffffffffff0;
      if (uVar9 == 0) {
        *(undefined8 *)local_50._M_string_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x11) {
        *(undefined8 *)local_50._M_string_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x19) {
        *(undefined8 *)local_50._M_string_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x21) {
        *(undefined8 *)local_50._M_string_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x31) {
        *(undefined8 *)local_50._M_string_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_50._M_string_length;
      }
      else if (uVar9 < 0x41) {
        *(undefined8 *)local_50._M_string_length = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_50._M_string_length;
      }
      else {
        operator_delete((void *)local_50._M_string_length,0x10);
      }
    }
  }
  if (*(int *)(::Lib::env + 0xe488) == 0) {
    pSVar8 = (SimplifyingGeneratingInference1 *)::operator_new(0x20);
    (pSVar8->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)0x0;
    (pSVar8->super_SimplifyingGeneratingInference).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar8->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)0x0;
    (pSVar8->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar8->super_SimplifyingGeneratingInference).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar8->super_ImmediateSimplificationEngine).super_InferenceEngine._salg =
         (SaturationAlgorithm *)0x0;
    (pSVar8->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)&PTR__SimplifyingGeneratingInference1_00b64d60;
    (pSVar8->super_ImmediateSimplificationEngine).super_InferenceEngine._vptr_InferenceEngine =
         (_func_int **)&PTR__GaussianVariableElimination_00b64db0;
    pIVar7 = Inferences::SimplifyingGeneratingInference1::asISE(pSVar8);
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  if (*(int *)(::Lib::env + 0xea98) == 0) {
    pSVar8 = (SimplifyingGeneratingInference1 *)::operator_new(0x30);
    Inferences::Cancellation::Cancellation((Cancellation *)pSVar8,ordering);
    pIVar7 = Inferences::SimplifyingGeneratingInference1::asISE(pSVar8);
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  lVar3 = ::Lib::env;
  if (!alascaTakesOver) {
    if (*(int *)(::Lib::env + 0xc7f8) == 2) {
      this_01 = (PolynomialEvaluationRule *)::operator_new(0x58);
      Inferences::PolynomialEvaluationRule::PolynomialEvaluationRule(this_01,ordering);
      this_00 = (InterpretedEvaluation *)
                Inferences::SimplifyingGeneratingInference1::asISE
                          ((SimplifyingGeneratingInference1 *)this_01);
    }
    else {
      if (*(int *)(::Lib::env + 0xc7f8) != 1) goto LAB_0069143d;
      this_00 = (InterpretedEvaluation *)::operator_new(0x18);
      Inferences::InterpretedEvaluation::InterpretedEvaluation
                (this_00,*(bool *)(lVar3 + 0xe2d2),ordering);
    }
    Inferences::CompositeISE::addFront(this,&this_00->super_ImmediateSimplificationEngine);
  }
LAB_0069143d:
  if (*(char *)(::Lib::env + 0xe3aa) == '\x01') {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__PushUnaryMinus_00b66610;
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
LAB_0069147b:
  if (cVar10 != '\0') {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b65b18;
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x18);
  (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b66888;
  *(undefined1 *)&pIVar7[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront(this,pIVar7);
  if (*(char *)(::Lib::env + 0xfd42) == '\x01') {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b65ab8;
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b65a58;
  Inferences::CompositeISE::addFront(this,pIVar7);
  if (*(int *)(::Lib::env + 0x8898) == 2) {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b660d8;
    Inferences::CompositeISE::addFront(this,pIVar7);
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b66138;
    Inferences::CompositeISE::addFront(this,pIVar7);
  }
  else if (*(int *)(::Lib::env + 0x8898) == 1) {
    pIVar7 = (ImmediateSimplificationEngine *)::operator_new(0x10);
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
    (pIVar7->super_InferenceEngine)._vptr_InferenceEngine =
         (_func_int **)&PTR__InferenceEngine_00b6da80;
    Inferences::CompositeISE::addFront(this,pIVar7);
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(::Lib::env + 0x8a90),
               *(long *)(::Lib::env + 0x8a98) + *(long *)(::Lib::env + 0x8a90));
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (iVar6 != 0) {
      this_02 = (UndesiredAnswerLiteralRemoval *)::operator_new(0x18);
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(::Lib::env + 0x8a90),
                 *(long *)(::Lib::env + 0x8a98) + *(long *)(::Lib::env + 0x8a90));
      Inferences::UndesiredAnswerLiteralRemoval::UndesiredAnswerLiteralRemoval(this_02,&local_50);
      Inferences::CompositeISE::addFront(this,(ImmediateSimplificationEngine *)this_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return this;
}

Assistant:

CompositeISE* SaturationAlgorithm::createISE(Problem& prb, const Options& opt, Ordering& ordering, bool alascaTakesOver)
{
  CompositeISE* res =new CompositeISE();

  bool mayHaveEquality = couldEqualityArise(prb,opt);

  if (mayHaveEquality && opt.equationalTautologyRemoval()) {
    res->addFront(new EquationalTautologyRemoval());
  }

  switch (opt.condensation()) {
    case Options::Condensation::ON:
      res->addFront(new Condensation());
      break;
    case Options::Condensation::FAST:
      res->addFront(new FastCondensation());
      break;
    case Options::Condensation::OFF:
      break;
  }

  if (env.options->combinatorySup()) {
    res->addFront(new CombinatorDemodISE());
    res->addFront(new CombinatorNormalisationISE());
  }

  if (env.options->choiceReasoning()) {
    res->addFront(new ChoiceDefinitionISE());
  }

  if((prb.hasLogicalProxy() || prb.hasBoolVar() || prb.hasFOOL()) &&
      prb.isHigherOrder() && !env.options->addProxyAxioms()){
    if(env.options->cnfOnTheFly() == Options::CNFOnTheFly::EAGER){
      /*res->addFrontMany(new ProxyISE());
      res->addFront(new OrImpAndProxyISE());
      res->addFront(new NotProxyISE());
      res->addFront(new EqualsProxyISE());
      res->addFront(new PiSigmaProxyISE());*/
      res->addFrontMany(new EagerClausificationISE());
    }
    else {
      res->addFront(new IFFXORRewriterISE());
    }
    res->addFront(new BoolSimp());
  }

  if (prb.hasFOOL() && opt.casesSimp() && !opt.cases()) {
    res->addFrontMany(new CasesSimp());
  }

  // Only add if there are distinct groups
  if (mayHaveEquality && env.signature->hasDistinctGroups()) {
    res->addFront(new DistinctEqualitySimplifier());
  }
  if (mayHaveEquality && env.signature->hasTermAlgebras()) {
    if (opt.termAlgebraInferences()) {
      res->addFront(new DistinctnessISE());
      res->addFront(new InjectivityISE());
      res->addFront(new NegativeInjectivityISE());
    }
  }
  if (prb.hasInterpretedOperations() || prb.hasNumerals()) {
    if (env.options->arithmeticSubtermGeneralizations() == Options::ArithmeticSimplificationMode::FORCE) {
      for (auto gen : allArithmeticSubtermGeneralizations()) {
        res->addFront(&gen->asISE());
      }
    }

    if (env.options->gaussianVariableElimination() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new GaussianVariableElimination())->asISE());
    }

    if (env.options->cancellation() == Options::ArithmeticSimplificationMode::FORCE) {
      res->addFront(&(new Cancellation(ordering))->asISE());
    }

    if (alascaTakesOver) {
      // all alasca rules are added later
    } else switch (env.options->evaluationMode()) {
      case Options::EvaluationMode::OFF:
        break;
      case Options::EvaluationMode::SIMPLE:
        res->addFront(new InterpretedEvaluation(env.options->inequalityNormalization(), ordering));
        break;
      case Options::EvaluationMode::POLYNOMIAL_FORCE:
        res->addFront(&(new PolynomialEvaluationRule(ordering))->asISE());
        break;
      case Options::EvaluationMode::POLYNOMIAL_CAUTIOUS:
        break;
    }

    if (env.options->pushUnaryMinus()) {
      res->addFront(new PushUnaryMinus());
    }
  }
  if (mayHaveEquality) {
    res->addFront(new TrivialInequalitiesRemovalISE());
  }
  res->addFront(new TautologyDeletionISE());
  if (env.options->newTautologyDel()) {
    res->addFront(new TautologyDeletionISE2());
  }
  res->addFront(new DuplicateLiteralRemovalISE());

  if (env.options->questionAnswering() == Options::QuestionAnsweringMode::PLAIN) {
    res->addFront(new AnswerLiteralResolver());
    if (env.options->questionAnsweringAvoidThese() != "") {
      res->addFront(new UndesiredAnswerLiteralRemoval(env.options->questionAnsweringAvoidThese()));
    }
  } else if (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS) {
    res->addFront(new UncomputableAnswerLiteralRemoval());
    res->addFront(new MultipleAnswerLiteralRemoval());
  }
  return res;
}